

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O3

void __thiscall DbCheckPostLower::CheckNestedHelperCalls(DbCheckPostLower *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  Instr *this_00;
  byte bVar5;
  Instr *pIVar6;
  
  pIVar4 = this->func->m_headInstr;
  if (pIVar4 != (Instr *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar5 = 0;
    pIVar6 = (Instr *)0x0;
    do {
      this_00 = pIVar4;
      if ((pIVar6 != (Instr *)0x0) && (pIVar6->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                           ,399,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                           ,"Modifying instr list but not using EDITING iterator!");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
        bVar5 = *(byte *)&this_00[1].m_func >> 1;
      }
      if (((bVar5 & 1) != 0) && (this_00->m_opcode == CALL)) {
        pIVar4 = this_00;
        bVar2 = IR::Instr::HasLazyBailOut(this_00);
        if (bVar2) {
          EnsureOnlyMovesToRegisterOpnd((DbCheckPostLower *)pIVar4,this_00);
        }
      }
      pIVar4 = this_00->m_next;
      pIVar6 = this_00;
    } while (this_00->m_next != (Instr *)0x0);
  }
  return;
}

Assistant:

void
DbCheckPostLower::CheckNestedHelperCalls()
{
    bool isInHelperBlock = false;
    FOREACH_INSTR_IN_FUNC(instr, this->func)
    {
        if (instr->IsLabelInstr())
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
        }

        if (!isInHelperBlock || instr->m_opcode != Js::OpCode::CALL || !instr->HasLazyBailOut())
        {
            continue;
        }

        this->EnsureOnlyMovesToRegisterOpnd(instr);

    } NEXT_INSTR_IN_FUNC;
}